

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpus_allowed.c
# Opt level: O0

cpu_set_t * cpus_allowed(size_t *setsize,int *maxcpu)

{
  int iVar1;
  char *__s;
  size_t sVar2;
  char *allowed;
  cpu_set_t *c;
  int *maxcpu_local;
  size_t *setsize_local;
  
  allowed = (char *)0x0;
  __s = status_entry("Cpus_allowed");
  if ((__s != (char *)0x0) && (sVar2 = strlen(__s), sVar2 != 0)) {
    iVar1 = high_bit_order(__s);
    *maxcpu = iVar1;
    if ((*maxcpu != -1) &&
       (allowed = (char *)__sched_cpualloc((long)(*maxcpu + 1)),
       (cpu_set_t *)allowed != (cpu_set_t *)0x0)) {
      *setsize = ((long)(*maxcpu + 1) + 0x3fU >> 6) << 3;
      set_cpu_bits(__s,(cpu_set_t *)allowed,*setsize);
    }
  }
  free(__s);
  return (cpu_set_t *)allowed;
}

Assistant:

cpu_set_t *
cpus_allowed(size_t *setsize, int *maxcpu)
{
	cpu_set_t *c = NULL;
	char *allowed = status_entry("Cpus_allowed");
	if (!allowed || strlen(allowed) == 0)
		goto done;
	*maxcpu = high_bit_order(allowed);
	if (*maxcpu == -1)
		goto done;
	c = CPU_ALLOC(*maxcpu+1);
	if (!c)
		goto done;
	*setsize = CPU_ALLOC_SIZE(*maxcpu+1);
	set_cpu_bits(allowed, c, *setsize);
done:
	free(allowed);
	return c;
}